

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sticky.cpp
# Opt level: O3

void __thiscall OpenMD::Sticky::calcForce(Sticky *this,InteractionData *idat)

{
  RealType *t;
  char cVar1;
  pointer piVar2;
  uint i_5;
  RotMat3x3d *pRVar3;
  long lVar4;
  double *pdVar5;
  uint i_2;
  long lVar6;
  uint i;
  long lVar7;
  RotMat3x3d *pRVar8;
  double *pdVar9;
  uint j;
  long lVar10;
  uint j_1;
  byte bVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Vector<double,_3U> result_6;
  Vector<double,_3U> result_15;
  Vector<double,_3U> result_14;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_7;
  RealType dspdr;
  RealType sp;
  RealType dsdr;
  RealType s;
  Vector<double,_3U> result_4;
  Vector<double,_3U> result_19;
  Vector<double,_3U> result_33;
  Vector<double,_3U> result_32;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result_34;
  Vector<double,_3U> result_31;
  Vector<double,_3U> result_27;
  RotMat3x3d A2trans;
  RotMat3x3d A1trans;
  double local_478 [4];
  double local_458 [4];
  double local_438 [4];
  double local_418 [4];
  undefined1 local_3f8 [16];
  double local_3e8 [4];
  RealType local_3c8;
  RealType local_3c0;
  double local_3b8;
  double dStack_3b0;
  RealType local_3a8;
  RealType local_3a0;
  double local_398 [4];
  undefined1 local_378 [16];
  double local_368;
  double dStack_360;
  double local_358;
  double local_350;
  double local_348 [4];
  double local_328;
  undefined8 uStack_320;
  undefined1 local_318 [16];
  double local_308;
  undefined8 uStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  undefined8 uStack_2e0;
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c8 [4];
  double local_2a8 [4];
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined1 local_268 [16];
  undefined8 local_258;
  undefined1 local_248 [16];
  double local_238;
  undefined1 local_228 [16];
  double local_218;
  undefined1 local_208 [16];
  double local_1f8;
  undefined1 local_1e8 [16];
  double local_1d8;
  double local_1c8 [10];
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148 [4];
  double local_128 [4];
  double local_108 [4];
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8 [10];
  double local_68 [9];
  
  bVar11 = 0;
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar2 = (this->Stids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar2[idat->atid1]].
                    super__Vector_base<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar6 = (long)piVar2[idat->atid2] * 0x58;
  local_308 = idat->rij;
  if (local_308 <= *(double *)(lVar4 + 0x20 + lVar6)) {
    local_e8 = *(double *)(lVar4 + 0x28 + lVar6);
    uStack_e0 = 0;
    local_350 = *(double *)(lVar4 + 0x30 + lVar6);
    local_358 = *(double *)(lVar4 + 0x38 + lVar6);
    dVar18 = *(double *)(lVar4 + lVar6);
    dVar13 = *(double *)(lVar4 + 8 + lVar6);
    local_378._0_8_ = *(double *)(lVar4 + 0x10 + lVar6);
    local_368 = *(double *)(lVar4 + 0x18 + lVar6);
    cVar1 = *(char *)(lVar4 + 0x50 + lVar6);
    t = &idat->rij;
    dVar15 = idat->r2;
    local_3f8._0_4_ = SUB84(dVar15,0);
    local_3f8._4_4_ = (undefined4)((ulong)dVar15 >> 0x20);
    local_3f8._8_4_ = 0;
    local_3f8._12_4_ = 0;
    local_2d8 = local_308 * dVar15;
    pRVar3 = &idat->A1;
    pdVar5 = local_68;
    local_68[6] = 0.0;
    local_68[7] = 0.0;
    local_68[4] = 0.0;
    local_68[5] = 0.0;
    local_68[2] = 0.0;
    local_68[3] = 0.0;
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_68[8] = 0.0;
    lVar7 = 0;
    pRVar8 = pRVar3;
    do {
      lVar10 = 0;
      pdVar9 = pdVar5;
      do {
        *pdVar9 = (pRVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                  [lVar10];
        lVar10 = lVar10 + 1;
        pdVar9 = pdVar9 + 3;
      } while (lVar10 != 3);
      lVar7 = lVar7 + 1;
      pdVar5 = pdVar5 + 1;
      pRVar8 = (RotMat3x3d *)
               ((pRVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar7 != 3);
    pdVar5 = local_b8;
    local_b8[6] = 0.0;
    local_b8[7] = 0.0;
    local_b8[4] = 0.0;
    local_b8[5] = 0.0;
    local_b8[2] = 0.0;
    local_b8[3] = 0.0;
    local_b8[0] = 0.0;
    local_b8[1] = 0.0;
    local_b8[8] = 0.0;
    lVar7 = 0;
    pRVar8 = &idat->A2;
    do {
      lVar10 = 0;
      pdVar9 = pdVar5;
      do {
        *pdVar9 = (pRVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                  [lVar10];
        lVar10 = lVar10 + 1;
        pdVar9 = pdVar9 + 3;
      } while (lVar10 != 3);
      lVar7 = lVar7 + 1;
      pdVar5 = pdVar5 + 1;
      pRVar8 = (RotMat3x3d *)
               ((pRVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar7 != 3);
    local_1c8[0] = 0.0;
    local_1c8[1] = 0.0;
    local_1c8[2] = 0.0;
    lVar7 = 0;
    do {
      dVar16 = local_1c8[lVar7];
      lVar10 = 0;
      do {
        dVar16 = dVar16 + (pRVar3->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][lVar10] * (idat->d).super_Vector<double,_3U>.data_[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      local_1c8[lVar7] = dVar16;
      local_328 = local_1c8[2];
      dStack_3b0 = local_1c8[1];
      local_3b8 = local_1c8[0];
      lVar7 = lVar7 + 1;
      pRVar3 = (RotMat3x3d *)
               ((pRVar3->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    } while (lVar7 != 3);
    pdVar5 = local_1c8;
    pRVar3 = &idat->A2;
    pdVar9 = pdVar5;
    for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
      *pdVar9 = (pRVar3->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0]
      ;
      pRVar3 = (RotMat3x3d *)((long)pRVar3 + (ulong)bVar11 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar11 * -2 + 1;
    }
    lVar7 = 0;
    do {
      lVar10 = 0;
      do {
        pdVar5[lVar10] = -pdVar5[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar7 = lVar7 + 1;
      pdVar5 = pdVar5 + 3;
    } while (lVar7 != 3);
    local_398[0] = 0.0;
    local_398[1] = 0.0;
    local_398[2] = 0.0;
    pdVar5 = local_1c8;
    lVar7 = 0;
    do {
      dVar16 = local_398[lVar7];
      lVar10 = 0;
      do {
        dVar16 = dVar16 + pdVar5[lVar10] * (idat->d).super_Vector<double,_3U>.data_[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      local_398[lVar7] = dVar16;
      lVar7 = lVar7 + 1;
      pdVar5 = pdVar5 + 3;
    } while (lVar7 != 3);
    local_158 = local_398[0];
    dStack_150 = local_398[1];
    local_3a0 = 0.0;
    local_3a8 = 0.0;
    local_3c0 = 0.0;
    local_3c8 = 0.0;
    local_168 = local_398[1];
    dStack_160 = local_398[1];
    local_178 = dStack_3b0;
    dStack_170 = dStack_3b0;
    uStack_2d0 = 0;
    uStack_320 = 0;
    local_2e8 = local_398[2];
    uStack_2e0 = 0;
    dVar16 = (double)local_378._0_8_;
    if (local_308 < dVar13) {
      if (dVar18 <= local_308) {
        local_3f8._8_8_ = 0;
        local_3f8._0_8_ = dVar15;
        CubicSpline::getValueAndDerivativeAt
                  (*(CubicSpline **)(lVar4 + lVar6 + 0x40),t,&local_3a0,&local_3a8);
        local_308 = *t;
        dVar16 = (double)local_378._0_8_;
      }
      else {
        local_3a0 = 1.0;
        local_3a8 = 0.0;
      }
    }
    local_3f8._0_8_ = (double)CONCAT44(local_3f8._4_4_,local_3f8._0_4_) * local_2d8;
    local_2f8 = local_3b8 * local_3b8;
    local_378._0_8_ = local_178 * local_178;
    local_d8 = local_328 * local_328;
    uStack_d0 = uStack_320;
    dVar18 = local_158 * local_158;
    local_318._0_8_ = local_168 * local_168;
    local_c8 = local_2e8 * local_2e8;
    uStack_c0 = uStack_2e0;
    if (local_308 < local_368) {
      if (dVar16 <= local_308) {
        dStack_360 = dStack_150;
        local_378._8_8_ = dStack_170;
        local_318._8_8_ = dStack_160;
        local_368 = dVar18;
        dStack_2f0 = dStack_3b0;
        CubicSpline::getValueAndDerivativeAt
                  (*(CubicSpline **)(lVar4 + lVar6 + 0x48),t,&local_3c0,&local_3c8);
        local_308 = *t;
        dVar18 = local_368;
      }
      else {
        local_3c0 = 1.0;
        local_3c8 = 0.0;
      }
    }
    uStack_300 = 0;
    local_2f8 = local_2f8 - (double)local_378._0_8_;
    local_368 = dVar18 - (double)local_318._0_8_;
    auVar25._0_8_ = local_3b8 * 4.0 * local_328;
    auVar25._8_8_ = dStack_3b0 * -4.0 * local_328;
    local_378._8_8_ = local_2d8;
    local_378._0_8_ = local_2d8;
    auVar26 = divpd(auVar25,local_378);
    auVar28._0_8_ = local_3b8 * 6.0 * local_328 * local_2f8;
    auVar28._8_8_ = dStack_3b0 * 6.0 * local_328 * local_2f8;
    auVar29._8_8_ = local_3f8._0_8_;
    auVar29._0_8_ = local_3f8._0_8_;
    auVar29 = divpd(auVar28,auVar29);
    local_1c8[0] = auVar26._0_8_ - auVar29._0_8_;
    local_1c8[1] = auVar26._8_8_ - auVar29._8_8_;
    local_1c8[2] = (local_2f8 + local_2f8) / local_2d8 -
                   (local_d8 * 6.0 * local_2f8) / (double)local_3f8._0_8_;
    dVar18 = local_2e8 * (local_368 + local_368);
    auVar26._8_4_ = (int)uStack_2e0;
    auVar26._0_8_ = dVar18;
    auVar26._12_4_ = (int)((ulong)uStack_2e0 >> 0x20);
    auVar19._0_8_ = local_158 * 6.0 * local_2e8 * local_368;
    auVar19._8_8_ = dStack_150 * 6.0 * local_2e8 * local_368;
    auVar20._8_8_ = local_3f8._0_8_;
    auVar20._0_8_ = local_3f8._0_8_;
    auVar20 = divpd(auVar19,auVar20);
    auVar17._0_8_ = local_158 * 4.0 * local_2e8;
    auVar17._8_8_ = dStack_150 * -4.0 * local_2e8;
    auVar29 = divpd(auVar17,local_378);
    local_398[0] = auVar29._0_8_ - auVar20._0_8_;
    local_398[1] = auVar29._8_8_ - auVar20._8_8_;
    local_398[2] = (local_368 + local_368) / local_2d8 -
                   (local_c8 * 6.0 * local_368) / (double)local_3f8._0_8_;
    auVar14._8_8_ = local_2e8;
    auVar14._0_8_ = local_328;
    local_318._8_8_ = local_308;
    local_318._0_8_ = local_308;
    auVar29 = divpd(auVar14,local_318);
    dVar23 = auVar29._0_8_ + -0.6;
    dVar27 = auVar29._8_8_ + -0.6;
    dVar13 = auVar29._0_8_ + 0.8;
    dVar15 = auVar29._8_8_ + 0.8;
    dVar21 = dVar23 * dVar23 * dVar13 + dVar23 * dVar13 * dVar13;
    dVar16 = dVar27 * dVar27 * dVar15 + dVar27 * dVar15 * dVar15;
    dVar31 = 1.0 / local_308 - local_d8 / local_2d8;
    dVar24 = local_3b8 * -2.0;
    auVar22._0_8_ = local_328 * dVar24 * dVar21;
    auVar22._8_8_ = local_328 * dStack_3b0 * -2.0 * dVar21;
    local_1e8 = divpd(auVar22,local_378);
    local_1d8 = (dVar31 + dVar31) * dVar21;
    dVar31 = 1.0 / local_308 - local_c8 / local_2d8;
    auVar30._0_8_ = local_2e8 * local_158 * -2.0 * dVar16;
    auVar30._8_8_ = local_2e8 * dStack_150 * -2.0 * dVar16;
    local_208 = divpd(auVar30,local_378);
    local_1f8 = (dVar31 + dVar31) * dVar16;
    auVar33._0_8_ = (local_d8 * dStack_3b0 + dStack_3b0 * 0.5 * local_2f8) * 4.0;
    auVar33._8_8_ = (local_d8 * local_3b8 + local_3b8 * -0.5 * local_2f8) * 4.0;
    local_228 = divpd(auVar33,local_378);
    local_218 = (local_3b8 * -8.0 * local_178 * local_328) / local_2d8;
    local_3f8._0_8_ = (local_328 * (local_2f8 + local_2f8)) / local_2d8;
    dStack_3b0 = auVar26._8_8_;
    local_3b8 = dVar18 / local_2d8;
    auVar12._0_8_ = (local_c8 * dStack_150 + dStack_150 * 0.5 * local_368) * 4.0;
    auVar12._8_8_ = (local_c8 * local_158 + local_158 * -0.5 * local_368) * 4.0;
    local_248 = divpd(auVar12,local_378);
    local_238 = (local_158 * -8.0 * local_168 * local_2e8) / local_2d8;
    auVar32._0_8_ = (local_178 + local_178) * dVar21;
    auVar32._8_8_ = dVar24 * dVar21;
    local_268 = divpd(auVar32,local_318);
    auVar34._0_8_ = (local_168 + local_168) * dVar16;
    auVar34._8_8_ = local_158 * -2.0 * dVar16;
    local_288 = divpd(auVar34,local_318);
    local_258 = 0;
    local_278 = 0;
    if (cVar1 == '\0') {
      dVar18 = (dVar27 * dVar27 * dVar15 * dVar15 - local_e8) +
               (dVar23 * dVar23 * dVar13 * dVar13 - local_e8);
      local_3f8._0_8_ = (double)local_3f8._0_8_ + local_3b8;
    }
    else {
      dStack_360 = local_368;
      dStack_2f0 = local_2f8;
      local_3f8._8_8_ = uStack_320;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"This is probably an error!\n",0x1b);
      local_418[0] = 0.0;
      local_418[1] = 0.0;
      local_418[2] = 0.0;
      lVar4 = 0;
      do {
        local_418[lVar4] =
             local_1c8[lVar4] * (double)local_3f8._0_8_ * (double)local_3f8._0_8_ * 0.75;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_478[0] = 0.0;
      local_478[1] = 0.0;
      local_478[2] = 0.0;
      lVar4 = 0;
      do {
        local_478[lVar4] = local_1c8[lVar4] * 0.75;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_3e8[0] = 0.0;
      local_3e8[1] = 0.0;
      local_3e8[2] = 0.0;
      lVar4 = 0;
      do {
        local_3e8[lVar4] = local_418[lVar4] + local_478[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_1c8[2] = local_3e8[2];
      local_1c8[0] = local_3e8[0];
      local_1c8[1] = local_3e8[1];
      dVar18 = local_3b8 * local_3b8 * 0.75;
      local_418[0] = 0.0;
      local_418[1] = 0.0;
      local_418[2] = 0.0;
      lVar4 = 0;
      do {
        local_418[lVar4] = local_1c8[lVar4] * dVar18;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_478[0] = 0.0;
      local_478[1] = 0.0;
      local_478[2] = 0.0;
      lVar4 = 0;
      do {
        local_478[lVar4] = local_1c8[lVar4] * 0.75;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_3e8[0] = 0.0;
      local_3e8[1] = 0.0;
      local_3e8[2] = 0.0;
      lVar4 = 0;
      do {
        local_3e8[lVar4] = local_418[lVar4] + local_478[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_398[2] = local_3e8[2];
      local_398[0] = local_3e8[0];
      local_398[1] = local_3e8[1];
      local_1e8._8_8_ = OpenMD::V3Zero._8_8_;
      local_1e8._0_8_ = OpenMD::V3Zero._0_8_;
      local_1d8 = (double)OpenMD::V3Zero._16_8_;
      local_208._8_8_ = OpenMD::V3Zero._8_8_;
      local_208._0_8_ = OpenMD::V3Zero._0_8_;
      local_1f8 = (double)OpenMD::V3Zero._16_8_;
      local_418[0] = 0.0;
      local_418[1] = 0.0;
      local_418[2] = 0.0;
      lVar4 = 0;
      do {
        local_418[lVar4] = *(double *)(local_248 + lVar4 * 8) * dVar18;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_478[0] = 0.0;
      local_478[1] = 0.0;
      local_478[2] = 0.0;
      lVar4 = 0;
      do {
        local_478[lVar4] = *(double *)(local_248 + lVar4 * 8) * 0.75;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_3e8[0] = 0.0;
      local_3e8[1] = 0.0;
      local_3e8[2] = 0.0;
      lVar4 = 0;
      do {
        local_3e8[lVar4] = local_418[lVar4] + local_478[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_218 = local_3e8[2];
      local_228._8_8_ = local_3e8[1];
      local_228._0_8_ = local_3e8[0];
      local_268._8_8_ = OpenMD::V3Zero._8_8_;
      local_268._0_8_ = OpenMD::V3Zero._0_8_;
      local_258 = OpenMD::V3Zero._16_8_;
      local_288._8_8_ = OpenMD::V3Zero._8_8_;
      local_288._0_8_ = OpenMD::V3Zero._0_8_;
      local_278 = OpenMD::V3Zero._16_8_;
      local_3f8._0_8_ =
           local_3b8 * 0.75 +
           local_3b8 * 0.25 * local_3b8 * local_3b8 +
           (double)local_3f8._0_8_ * 0.25 * (double)local_3f8._0_8_ * (double)local_3f8._0_8_ +
           (double)local_3f8._0_8_ * 0.75 + local_358;
      local_3c8 = 0.0;
      local_3c0 = 0.0;
      dVar18 = 0.0;
    }
    dVar15 = local_3a0 * local_350;
    local_3c0 = local_3c0 * local_358;
    dVar16 = (dVar15 * (double)local_3f8._0_8_ + dVar18 * local_3c0) * 0.5;
    idat->vpair = idat->vpair + dVar16;
    dVar13 = idat->sw;
    dVar16 = dVar16 * dVar13;
    (idat->pot).data_[5] = (idat->pot).data_[5] + dVar16;
    if (idat->isSelected == true) {
      (idat->selePot).data_[5] = dVar16 + (idat->selePot).data_[5];
    }
    local_438[0] = 0.0;
    local_438[1] = 0.0;
    local_438[2] = 0.0;
    lVar4 = 0;
    do {
      local_438[lVar4] = *(double *)(local_228 + lVar4 * 8) * dVar15;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_458[0] = 0.0;
    local_458[1] = 0.0;
    local_458[2] = 0.0;
    lVar4 = 0;
    do {
      local_458[lVar4] = *(double *)(local_268 + lVar4 * 8) * local_3c0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_478[0] = 0.0;
    local_478[1] = 0.0;
    local_478[2] = 0.0;
    lVar4 = 0;
    do {
      local_478[lVar4] = local_438[lVar4] + local_458[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_418[0] = 0.0;
    local_418[1] = 0.0;
    local_418[2] = 0.0;
    lVar4 = 0;
    do {
      local_418[lVar4] = local_478[lVar4] * dVar13 * 0.5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_3e8[2] = local_418[2];
    local_3e8[0] = local_418[0];
    local_3e8[1] = local_418[1];
    local_458[0] = 0.0;
    local_458[1] = 0.0;
    local_458[2] = 0.0;
    lVar4 = 0;
    do {
      local_458[lVar4] = *(double *)(local_248 + lVar4 * 8) * dVar15;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[2] = 0.0;
    lVar4 = 0;
    do {
      local_348[lVar4] = *(double *)(local_288 + lVar4 * 8) * local_3c0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_438[0] = 0.0;
    local_438[1] = 0.0;
    local_438[2] = 0.0;
    lVar4 = 0;
    do {
      local_438[lVar4] = local_458[lVar4] + local_348[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_478[0] = 0.0;
    local_478[1] = 0.0;
    local_478[2] = 0.0;
    lVar4 = 0;
    do {
      local_478[lVar4] = local_438[lVar4] * dVar13 * 0.5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_418[2] = local_478[2];
    local_418[0] = local_478[0];
    local_418[1] = local_478[1];
    local_478[0] = 0.0;
    local_478[1] = 0.0;
    local_478[2] = 0.0;
    pdVar5 = local_68;
    lVar4 = 0;
    do {
      dVar16 = local_478[lVar4];
      lVar6 = 0;
      do {
        dVar16 = dVar16 + pdVar5[lVar6] * local_3e8[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      local_478[lVar4] = dVar16;
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 3;
    } while (lVar4 != 3);
    lVar4 = 0;
    do {
      (idat->t1).super_Vector<double,_3U>.data_[lVar4] =
           local_478[lVar4] + (idat->t1).super_Vector<double,_3U>.data_[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_478[0] = 0.0;
    local_478[1] = 0.0;
    local_478[2] = 0.0;
    pdVar5 = local_b8;
    lVar4 = 0;
    do {
      dVar16 = local_478[lVar4];
      lVar6 = 0;
      do {
        dVar16 = dVar16 + pdVar5[lVar6] * local_418[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      local_478[lVar4] = dVar16;
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 3;
    } while (lVar4 != 3);
    lVar4 = 0;
    do {
      (idat->t2).super_Vector<double,_3U>.data_[lVar4] =
           local_478[lVar4] + (idat->t2).super_Vector<double,_3U>.data_[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_438[0] = 0.0;
    local_438[1] = 0.0;
    local_438[2] = 0.0;
    lVar4 = 0;
    do {
      local_438[lVar4] = local_1c8[lVar4] * dVar15;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_458[0] = 0.0;
    local_458[1] = 0.0;
    local_458[2] = 0.0;
    lVar4 = 0;
    do {
      local_458[lVar4] = *(double *)(local_1e8 + lVar4 * 8) * local_3c0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_478[0] = 0.0;
    local_478[1] = 0.0;
    local_478[2] = 0.0;
    lVar4 = 0;
    do {
      local_478[lVar4] = local_438[lVar4] + local_458[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_108[0] = 0.0;
    local_108[1] = 0.0;
    local_108[2] = 0.0;
    lVar4 = 0;
    do {
      local_108[lVar4] = local_478[lVar4] * dVar13;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_438[0] = 0.0;
    local_438[1] = 0.0;
    local_438[2] = 0.0;
    lVar4 = 0;
    do {
      local_438[lVar4] = local_398[lVar4] * dVar15;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_458[0] = 0.0;
    local_458[1] = 0.0;
    local_458[2] = 0.0;
    lVar4 = 0;
    do {
      local_458[lVar4] = *(double *)(local_208 + lVar4 * 8) * local_3c0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_478[0] = 0.0;
    local_478[1] = 0.0;
    local_478[2] = 0.0;
    lVar4 = 0;
    do {
      local_478[lVar4] = local_438[lVar4] + local_458[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_128[0] = 0.0;
    local_128[1] = 0.0;
    local_128[2] = 0.0;
    lVar4 = 0;
    do {
      local_128[lVar4] = local_478[lVar4] * dVar13;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_2a8[0] = 0.0;
    local_2a8[1] = 0.0;
    local_2a8[2] = 0.0;
    pdVar5 = local_68;
    lVar4 = 0;
    do {
      dVar13 = local_2a8[lVar4];
      lVar6 = 0;
      do {
        dVar13 = dVar13 + pdVar5[lVar6] * local_108[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      local_2a8[lVar4] = dVar13;
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 3;
    } while (lVar4 != 3);
    local_2c8[0] = 0.0;
    local_2c8[1] = 0.0;
    local_2c8[2] = 0.0;
    pdVar5 = local_b8;
    lVar4 = 0;
    do {
      dVar13 = local_2c8[lVar4];
      lVar6 = 0;
      do {
        dVar13 = dVar13 + pdVar5[lVar6] * local_128[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      local_2c8[lVar4] = dVar13;
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 3;
    } while (lVar4 != 3);
    local_148[0] = 0.0;
    local_148[1] = 0.0;
    local_148[2] = 0.0;
    lVar4 = 0;
    do {
      local_148[lVar4] =
           (idat->d).super_Vector<double,_3U>.data_[lVar4] *
           (local_350 * local_3a8 * (double)local_3f8._0_8_ + dVar18 * local_358 * local_3c8);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    dVar18 = *t;
    local_348[0] = 0.0;
    local_348[1] = 0.0;
    local_348[2] = 0.0;
    lVar4 = 0;
    do {
      local_348[lVar4] = local_148[lVar4] / dVar18;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_458[0] = 0.0;
    local_458[1] = 0.0;
    local_458[2] = 0.0;
    lVar4 = 0;
    do {
      local_458[lVar4] = local_348[lVar4] + local_2a8[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_438[0] = 0.0;
    local_438[1] = 0.0;
    local_438[2] = 0.0;
    lVar4 = 0;
    do {
      local_438[lVar4] = local_458[lVar4] - local_2c8[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    local_478[0] = 0.0;
    local_478[1] = 0.0;
    local_478[2] = 0.0;
    lVar4 = 0;
    do {
      local_478[lVar4] = local_438[lVar4] * 0.5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar4 = 0;
    do {
      (idat->f1).super_Vector<double,_3U>.data_[lVar4] =
           local_478[lVar4] + (idat->f1).super_Vector<double,_3U>.data_[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
  }
  return;
}

Assistant:

void Sticky::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    StickyInteractionData& mixer =
        MixingMap[Stids[idat.atid1]][Stids[idat.atid2]];

    RealType w0   = mixer.w0;
    RealType v0   = mixer.v0;
    RealType v0p  = mixer.v0p;
    RealType rl   = mixer.rl;
    RealType ru   = mixer.ru;
    RealType rlp  = mixer.rlp;
    RealType rup  = mixer.rup;
    RealType rbig = mixer.rbig;
    bool isPower  = mixer.isPower;

    if (idat.rij <= rbig) {
      RealType r3 = idat.r2 * idat.rij;
      RealType r5 = r3 * idat.r2;

      RotMat3x3d A1trans = idat.A1.transpose();
      RotMat3x3d A2trans = idat.A2.transpose();

      // rotate the inter-particle separation into the two different
      // body-fixed coordinate systems:

      Vector3d ri = idat.A1 * idat.d;

      // negative sign because this is the vector from j to i:

      Vector3d rj = -idat.A2 * idat.d;

      RealType xi = ri.x();
      RealType yi = ri.y();
      RealType zi = ri.z();

      RealType xj = rj.x();
      RealType yj = rj.y();
      RealType zj = rj.z();

      RealType xi2 = xi * xi;
      RealType yi2 = yi * yi;
      RealType zi2 = zi * zi;

      RealType xj2 = xj * xj;
      RealType yj2 = yj * yj;
      RealType zj2 = zj * zj;

      // calculate the switching info. from the splines

      RealType s     = 0.0;
      RealType dsdr  = 0.0;
      RealType sp    = 0.0;
      RealType dspdr = 0.0;

      if (idat.rij < ru) {
        if (idat.rij < rl) {
          s    = 1.0;
          dsdr = 0.0;
        } else {
          // we are in the switching region
          mixer.s->getValueAndDerivativeAt(idat.rij, s, dsdr);
        }
      }

      if (idat.rij < rup) {
        if (idat.rij < rlp) {
          sp    = 1.0;
          dspdr = 0.0;
        } else {
          // we are in the switching region
          mixer.sp->getValueAndDerivativeAt(idat.rij, sp, dspdr);
        }
      }

      RealType wi = 2.0 * (xi2 - yi2) * zi / r3;
      RealType wj = 2.0 * (xj2 - yj2) * zj / r3;
      RealType w  = wi + wj;

      RealType zif = zi / idat.rij - 0.6;
      RealType zis = zi / idat.rij + 0.8;

      RealType zjf = zj / idat.rij - 0.6;
      RealType zjs = zj / idat.rij + 0.8;

      RealType wip = zif * zif * zis * zis - w0;
      RealType wjp = zjf * zjf * zjs * zjs - w0;
      RealType wp  = wip + wjp;

      Vector3d dwi(4.0 * xi * zi / r3 - 6.0 * xi * zi * (xi2 - yi2) / r5,
                   -4.0 * yi * zi / r3 - 6.0 * yi * zi * (xi2 - yi2) / r5,
                   2.0 * (xi2 - yi2) / r3 - 6.0 * zi2 * (xi2 - yi2) / r5);

      Vector3d dwj(4.0 * xj * zj / r3 - 6.0 * xj * zj * (xj2 - yj2) / r5,
                   -4.0 * yj * zj / r3 - 6.0 * yj * zj * (xj2 - yj2) / r5,
                   2.0 * (xj2 - yj2) / r3 - 6.0 * zj2 * (xj2 - yj2) / r5);

      RealType uglyi = zif * zif * zis + zif * zis * zis;
      RealType uglyj = zjf * zjf * zjs + zjf * zjs * zjs;

      Vector3d dwip(-2.0 * xi * zi * uglyi / r3, -2.0 * yi * zi * uglyi / r3,
                    2.0 * (1.0 / idat.rij - zi2 / r3) * uglyi);

      Vector3d dwjp(-2.0 * xj * zj * uglyj / r3, -2.0 * yj * zj * uglyj / r3,
                    2.0 * (1.0 / idat.rij - zj2 / r3) * uglyj);

      Vector3d dwidu(4.0 * (yi * zi2 + 0.5 * yi * (xi2 - yi2)) / r3,
                     4.0 * (xi * zi2 - 0.5 * xi * (xi2 - yi2)) / r3,
                     -8.0 * xi * yi * zi / r3);

      Vector3d dwjdu(4.0 * (yj * zj2 + 0.5 * yj * (xj2 - yj2)) / r3,
                     4.0 * (xj * zj2 - 0.5 * xj * (xj2 - yj2)) / r3,
                     -8.0 * xj * yj * zj / r3);

      Vector3d dwipdu(2.0 * yi * uglyi / idat.rij, -2.0 * xi * uglyi / idat.rij,
                      0.0);

      Vector3d dwjpdu(2.0 * yj * uglyj / idat.rij, -2.0 * xj * uglyj / idat.rij,
                      0.0);

      if (isPower) {
        cerr << "This is probably an error!\n";
        RealType frac1 = 0.25;
        RealType frac2 = 0.75;
        RealType wi2   = wi * wi;
        RealType wj2   = wj * wj;
        // sticky power has no w' function:
        w = frac1 * wi * wi2 + frac2 * wi + frac1 * wj * wj2 + frac2 * wj + v0p;
        wp     = 0.0;
        dwi    = frac1 * RealType(3.0) * wi2 * dwi + frac2 * dwi;
        dwj    = frac1 * RealType(3.0) * wj2 * dwi + frac2 * dwi;
        dwip   = V3Zero;
        dwjp   = V3Zero;
        dwidu  = frac1 * RealType(3.0) * wi2 * dwidu + frac2 * dwidu;
        dwidu  = frac1 * RealType(3.0) * wj2 * dwjdu + frac2 * dwjdu;
        dwipdu = V3Zero;
        dwjpdu = V3Zero;
        sp     = 0.0;
        dspdr  = 0.0;
      }

      idat.vpair += 0.5 * (v0 * s * w + v0p * sp * wp);
      idat.pot[HYDROGENBONDING_FAMILY] +=
          0.5 * (v0 * s * w + v0p * sp * wp) * idat.sw;
      if (idat.isSelected)
        idat.selePot[HYDROGENBONDING_FAMILY] +=
            0.5 * (v0 * s * w + v0p * sp * wp) * idat.sw;

      // do the torques first since they are easy:
      // remember that these are still in the body-fixed axes

      Vector3d ti = 0.5 * idat.sw * (v0 * s * dwidu + v0p * sp * dwipdu);
      Vector3d tj = 0.5 * idat.sw * (v0 * s * dwjdu + v0p * sp * dwjpdu);

      // go back to lab frame using transpose of rotation matrix:

      idat.t1 += A1trans * ti;
      idat.t2 += A2trans * tj;

      // Now, on to the forces:

      // first rotate the i terms back into the lab frame:

      Vector3d radcomi = (v0 * s * dwi + v0p * sp * dwip) * idat.sw;
      Vector3d radcomj = (v0 * s * dwj + v0p * sp * dwjp) * idat.sw;

      Vector3d fii = A1trans * radcomi;
      Vector3d fjj = A2trans * radcomj;

      // now assemble these with the radial-only terms:

      idat.f1 += 0.5 * ((v0 * dsdr * w + v0p * dspdr * wp) * idat.d / idat.rij +
                        fii - fjj);
    }

    return;
  }